

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall BpTree<int>::FindKey(BpTree<int> *this,int k,IndexNode<int> *C)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Addr *pAVar8;
  long lVar9;
  size_t __n;
  bool bVar10;
  IndexNode<int> D;
  vector<int,_std::allocator<int>_> local_e8;
  _Vector_base<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_90,this->N);
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
    cVar1 = C->NodeState;
    while (cVar1 != '1') {
      uVar5 = this->N - 1;
      uVar4 = 0;
      if (this->N < 2) {
LAB_0012c05f:
        bVar10 = (uint)uVar4 == uVar5;
        uVar5 = (uint)uVar4;
        if (bVar10) goto LAB_0012c063;
        uVar4 = uVar4 & 0xffffffff;
        if ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4] == '0') goto LAB_0012c073;
        iVar2 = (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar4];
        if (iVar2 == k) {
          FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4],&local_90);
          std::vector<int,_std::allocator<int>_>::vector(&local_e8,&local_90.k);
          local_d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                    (&local_d0,
                     (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          pcVar3 = local_d0._M_impl.super__Vector_impl_data._M_start;
          __n = (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (__n != 0) {
            memmove(local_d0._M_impl.super__Vector_impl_data._M_start,
                    local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,__n);
          }
          local_d0._M_impl.super__Vector_impl_data._M_finish = pcVar3 + __n;
          std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,&local_90.p);
          local_a0 = local_90.parent;
          AStack_98 = local_90.self;
          uVar5 = this->N - 1;
          uVar6 = 0;
          if (this->N < 2) {
LAB_0012c187:
            lVar9 = 8;
            if ((uint)uVar6 != uVar5) {
              lVar9 = (ulong)(local_d0._M_impl.super__Vector_impl_data._M_start[uVar6 & 0xffffffff]
                             == '0') << 3;
            }
          }
          else {
            uVar6 = 0;
            do {
              if ((local_d0._M_impl.super__Vector_impl_data._M_start[uVar6] != '1') ||
                 (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6] == k)) goto LAB_0012c187;
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
            lVar9 = 8;
          }
          if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_d0._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d0._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d0._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pAVar8 = (Addr *)((long)&(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar4].BlockNum + lVar9);
          goto LAB_0012c07b;
        }
        if (k < iVar2) goto LAB_0012c073;
      }
      else {
        uVar4 = 0;
        do {
          if (((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] != '1') ||
             (k <= (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4])) goto LAB_0012c05f;
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
LAB_0012c063:
        uVar4 = (ulong)uVar5;
LAB_0012c073:
        pAVar8 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar4;
LAB_0012c07b:
        FindNode(this,*pAVar8,C);
      }
      cVar1 = C->NodeState;
    }
    uVar5 = this->N - 1;
    uVar4 = 0;
    if (this->N < 2) {
LAB_0012bfa8:
      uVar7 = 0xffffffff;
      if (((uint)uVar4 != uVar5) &&
         (uVar7 = 0xffffffff,
         (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar4 & 0xffffffff] != '0')) {
        uVar7 = (uint)uVar4;
      }
      goto LAB_0012bfbe;
    }
    uVar4 = 0;
    do {
      if (((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar4] != '1') ||
         ((C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] == k)) goto LAB_0012bfa8;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  uVar7 = 0xffffffff;
LAB_0012bfbe:
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar7;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}